

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  bool bVar1;
  int iVar2;
  Arena *pAVar3;
  pointer this_00;
  LogMessageFatal local_20;
  
  bVar1 = RepeatedField<google::protobuf::UnknownField>::empty(&this->fields_);
  if (!bVar1) {
    pAVar3 = RepeatedField<google::protobuf::UnknownField>::GetArena(&this->fields_);
    if (pAVar3 == (Arena *)0x0) {
      iVar2 = RepeatedField<google::protobuf::UnknownField>::size(&this->fields_);
      iVar2 = iVar2 + 1;
      do {
        this_00 = RepeatedField<google::protobuf::UnknownField>::Mutable(&this->fields_,iVar2 + -2);
        UnknownField::Delete(this_00);
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
    RepeatedField<google::protobuf::UnknownField>::Clear(&this->fields_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.cc"
             ,0x27,"!fields_.empty()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  ABSL_DCHECK(!fields_.empty());
  if (arena() == nullptr) {
    int n = fields_.size();
    do {
      (fields_)[--n].Delete();
    } while (n > 0);
  }
  fields_.Clear();
}